

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_start(JUnitReporter *this,TestCaseData *in)

{
  char *pcVar1;
  ticks_t tVar2;
  TestCaseData *file;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  pcVar1 = skipPathFromFilename((char *)file);
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_51);
  std::__cxx11::string::string((string *)&local_50,in->m_name,&local_52);
  JUnitTestCaseData::add(&this->testCaseData,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  tVar2 = detail::getCurrentTicks();
  (this->timer).m_ticks = tVar2;
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
            timer.start();
        }